

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::ShaderSubroutine::FunctionalTest10::iterate(FunctionalTest10 *this)

{
  bool bVar1;
  GLuint GVar2;
  ContextInfo *pCVar3;
  NotSupportedError *pNVar4;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar5;
  socklen_t __len;
  sockaddr *__addr;
  socklen_t __fd;
  MessageBuilder local_250;
  GLint local_cc;
  int local_c8;
  GLint mix_result;
  GLint decrement_result;
  GLint increment_result;
  GLuint uniform;
  GLuint routine;
  vertexArray vao;
  buffer transform_feedback_buffer;
  program program;
  undefined1 local_68 [5];
  bool result;
  undefined1 local_45;
  allocator<char> local_31;
  string local_30;
  FunctionalTest10 *local_10;
  FunctionalTest10 *this_local;
  
  local_10 = this;
  pCVar3 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(pCVar3,"GL_ARB_shader_subroutine");
  if (!bVar1) {
    local_45 = 1;
    pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"GL_ARB_shader_subroutine is not supported.",&local_31);
    tcu::NotSupportedError::NotSupportedError(pNVar4,&local_30);
    local_45 = 0;
    __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  pCVar3 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(pCVar3,"GL_ARB_arrays_of_arrays");
  if (!bVar1) {
    program.m_context._6_1_ = 1;
    pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_68,"GL_ARB_arrays_of_arrays is not supported.",
               (allocator<char> *)((long)&program.m_context + 7));
    tcu::NotSupportedError::NotSupportedError(pNVar4,(string *)local_68);
    program.m_context._6_1_ = 0;
    __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  program.m_context._5_1_ = 1;
  Utils::program::program
            ((program *)&transform_feedback_buffer.m_context,(this->super_TestCase).m_context);
  Utils::buffer::buffer((buffer *)&vao.m_context,(this->super_TestCase).m_context);
  Utils::vertexArray::vertexArray((vertexArray *)&uniform,(this->super_TestCase).m_context);
  __len = 0;
  __fd = __len;
  Utils::program::build
            ((program *)&transform_feedback_buffer.m_context,(GLchar *)0x0,(GLchar *)0x0,
             (GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,iterate::vertex_shader_code,
             &iterate::varying_name,1,false);
  Utils::program::use((program *)&transform_feedback_buffer.m_context);
  Utils::vertexArray::generate((vertexArray *)&uniform);
  Utils::vertexArray::bind((vertexArray *)&uniform,__fd,__addr,__len);
  Utils::buffer::generate((buffer *)&vao.m_context);
  Utils::buffer::update((buffer *)&vao.m_context,0x8c8e,4,(GLvoid *)0x0,0x88ea);
  Utils::buffer::bindRange((buffer *)&vao.m_context,0x8c8e,0,0,4);
  for (increment_result = 0; (uint)increment_result < 2; increment_result = increment_result + 1) {
    GVar2 = Utils::program::getSubroutineIndex
                      ((program *)&transform_feedback_buffer.m_context,
                       iterate::subroutine_names[(uint)increment_result],0x8b31);
    this->m_subroutine_indices[(uint)increment_result] = GVar2;
  }
  for (decrement_result = 0; (uint)decrement_result < 0x10; decrement_result = decrement_result + 1)
  {
    GVar2 = Utils::program::getSubroutineUniformLocation
                      ((program *)&transform_feedback_buffer.m_context,
                       iterate::subroutine_uniform_names[(uint)decrement_result],0x8b31);
    this->m_subroutine_uniform_locations[(uint)decrement_result] = GVar2;
  }
  mix_result = testDraw(this,iterate::configuration_increment);
  local_c8 = testDraw(this,iterate::configuration_decrement);
  local_cc = testDraw(this,iterate::configuration_mix);
  if (mix_result != 0x10) {
    program.m_context._5_1_ = 0;
  }
  if (local_c8 != -0x10) {
    program.m_context._5_1_ = 0;
  }
  if (local_cc != 0) {
    program.m_context._5_1_ = 0;
  }
  if ((program.m_context._5_1_ & 1) == 1) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_250,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_250,(char (*) [23])"Error. Invalid result.");
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(char (*) [35])" Incrementation applied 16 times: ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&mix_result);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(char (*) [36])". Decrementation applied 16 times: ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_c8);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(char (*) [54])
                               ". Incrementation and decrementation applied 8 times: ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_cc);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_250);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
  Utils::vertexArray::~vertexArray((vertexArray *)&uniform);
  Utils::buffer::~buffer((buffer *)&vao.m_context);
  Utils::program::~program((program *)&transform_feedback_buffer.m_context);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest10::iterate()
{
	static const GLchar* vertex_shader_code = "#version 400 core\n"
											  "#extension GL_ARB_arrays_of_arrays  : require\n"
											  "#extension GL_ARB_shader_subroutine : require\n"
											  "\n"
											  "precision highp float;\n"
											  "\n"
											  "// Subroutine type\n"
											  "subroutine int routine_type(in int iparam);\n"
											  "\n"
											  "// Subroutine definitions\n"
											  "subroutine(routine_type) int increment(in int iparam)\n"
											  "{\n"
											  "    return iparam + 1;\n"
											  "}\n"
											  "\n"
											  "subroutine(routine_type) int decrement(in int iparam)\n"
											  "{\n"
											  "    return iparam - 1;\n"
											  "}\n"
											  "\n"
											  "// Sub routine uniform\n"
											  "subroutine uniform routine_type routine[4][4];\n"
											  "\n"
											  "// Output\n"
											  "out int out_result;\n"
											  "\n"
											  "void main()\n"
											  "{\n"
											  "    int result = 0;\n"
											  "    \n"
											  "    for (uint j = 0; j < routine.length(); ++j)\n"
											  "    {\n"
											  "        for (uint i = 0; i < routine[j].length(); ++i)\n"
											  "        {\n"
											  "            result = routine[j][i](result);\n"
											  "        }\n"
											  "    }\n"
											  "    \n"
											  "    out_result = result;\n"
											  "}\n"
											  "\n";

	static const GLchar* subroutine_names[] = {
		"increment", "decrement",
	};
	static const GLuint n_subroutine_names = sizeof(subroutine_names) / sizeof(subroutine_names[0]);

	static const GLchar* subroutine_uniform_names[] = {
		"routine[0][0]", "routine[1][0]", "routine[2][0]", "routine[3][0]", "routine[0][1]", "routine[1][1]",
		"routine[2][1]", "routine[3][1]", "routine[0][2]", "routine[1][2]", "routine[2][2]", "routine[3][2]",
		"routine[0][3]", "routine[1][3]", "routine[2][3]", "routine[3][3]"
	};
	static const GLuint n_subroutine_uniform_names =
		sizeof(subroutine_uniform_names) / sizeof(subroutine_uniform_names[0]);

	static const GLchar* varying_name					= "out_result";
	static const GLuint  transform_feedback_buffer_size = sizeof(GLint);

	static const GLuint configuration_increment[16] = { 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };

	static const GLuint configuration_decrement[16] = { 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1 };

	static const GLuint configuration_mix[16] = { 1, 0, 0, 1, 1, 0, 0, 1, 1, 0, 0, 1, 1, 0, 0, 1 };

	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* Do not execute the test if GL_ARB_arrays_of_arrays is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_arrays_of_arrays"))
	{
		throw tcu::NotSupportedError("GL_ARB_arrays_of_arrays is not supported.");
	}

	bool result = true;

	/* GL objects */
	Utils::program	 program(m_context);
	Utils::buffer	  transform_feedback_buffer(m_context);
	Utils::vertexArray vao(m_context);

	/* Init GL objects */
	program.build(0 /* cs */, 0 /* fs */, 0 /* gs */, 0 /* tcs */, 0 /* test */, vertex_shader_code, &varying_name,
				  1 /* n_varyings */);

	program.use();

	vao.generate();
	vao.bind();

	transform_feedback_buffer.generate();
	transform_feedback_buffer.update(GL_TRANSFORM_FEEDBACK_BUFFER, transform_feedback_buffer_size, 0 /* data */,
									 GL_DYNAMIC_COPY);
	transform_feedback_buffer.bindRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, 0, transform_feedback_buffer_size);

	/* Get subroutine indices */
	for (GLuint routine = 0; routine < n_subroutine_names; ++routine)
	{
		m_subroutine_indices[routine] = program.getSubroutineIndex(subroutine_names[routine], GL_VERTEX_SHADER);
	}

	/* Get subroutine uniform locations */
	for (GLuint uniform = 0; uniform < n_subroutine_uniform_names; ++uniform)
	{
		m_subroutine_uniform_locations[uniform] =
			program.getSubroutineUniformLocation(subroutine_uniform_names[uniform], GL_VERTEX_SHADER);
	}

	/* Test */
	GLint increment_result = testDraw(configuration_increment);
	GLint decrement_result = testDraw(configuration_decrement);
	GLint mix_result	   = testDraw(configuration_mix);

	/* Verify */
	if (16 != increment_result)
	{
		result = false;
	}

	if (-16 != decrement_result)
	{
		result = false;
	}
	if (0 != mix_result)
	{
		result = false;
	}

	/* Set test result */
	if (true == result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Error. Invalid result."
											<< " Incrementation applied 16 times: " << increment_result
											<< ". Decrementation applied 16 times: " << decrement_result
											<< ". Incrementation and decrementation applied 8 times: " << mix_result
											<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}